

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O0

void __thiscall
flatbuffers::php::PhpGenerator::BeginFile
          (PhpGenerator *this,string *name_space_name,bool needs_imports,string *code_ptr)

{
  char *__rhs;
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  string *code;
  string *code_ptr_local;
  string *psStack_18;
  bool needs_imports_local;
  string *name_space_name_local;
  PhpGenerator *this_local;
  
  local_30 = code_ptr;
  code = code_ptr;
  code_ptr_local._7_1_ = needs_imports;
  psStack_18 = name_space_name;
  name_space_name_local = (string *)this;
  std::__cxx11::string::operator+=((string *)code_ptr,"<?php\n");
  std::operator+(&local_90,local_30,"// ");
  __rhs = BaseGenerator::FlatBuffersGeneratedWarning();
  std::operator+(&local_70,&local_90,__rhs);
  std::operator+(&local_50,&local_70,"\n\n");
  std::__cxx11::string::operator=((string *)local_30,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+(&local_e0,"namespace ",psStack_18);
    std::operator+(&local_c0,&local_e0,";\n\n");
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  if ((code_ptr_local._7_1_ & 1) != 0) {
    std::__cxx11::string::operator+=((string *)local_30,"use \\Google\\FlatBuffers\\Struct;\n");
    std::__cxx11::string::operator+=((string *)local_30,"use \\Google\\FlatBuffers\\Table;\n");
    std::__cxx11::string::operator+=((string *)local_30,"use \\Google\\FlatBuffers\\ByteBuffer;\n");
    std::__cxx11::string::operator+=
              ((string *)local_30,"use \\Google\\FlatBuffers\\FlatBufferBuilder;\n");
    std::__cxx11::string::operator+=((string *)local_30,"\n");
  }
  return;
}

Assistant:

void BeginFile(const std::string &name_space_name, const bool needs_imports,
                 std::string *code_ptr) {
    auto &code = *code_ptr;
    code += "<?php\n";
    code = code + "// " + FlatBuffersGeneratedWarning() + "\n\n";

    if (!name_space_name.empty()) {
      code += "namespace " + name_space_name + ";\n\n";
    }

    if (needs_imports) {
      code += "use \\Google\\FlatBuffers\\Struct;\n";
      code += "use \\Google\\FlatBuffers\\Table;\n";
      code += "use \\Google\\FlatBuffers\\ByteBuffer;\n";
      code += "use \\Google\\FlatBuffers\\FlatBufferBuilder;\n";
      code += "\n";
    }
  }